

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::AttachInfo::Deserialize(AttachInfo *this,Deserializer *deserializer)

{
  OnCreateConflict OVar1;
  uint uVar2;
  int iVar3;
  pointer pAVar4;
  pointer *__ptr;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  local_58._M_head_impl = (AttachInfo *)operator_new(0x90);
  ((local_58._M_head_impl)->super_ParseInfo).info_type = ATTACH_INFO;
  ((local_58._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__AttachInfo_024b3f78;
  ((local_58._M_head_impl)->name)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->name).field_2;
  ((local_58._M_head_impl)->name)._M_string_length = 0;
  ((local_58._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->path)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->path).field_2;
  ((local_58._M_head_impl)->path)._M_string_length = 0;
  ((local_58._M_head_impl)->path).field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->options)._M_h._M_buckets =
       &((local_58._M_head_impl)->options)._M_h._M_single_bucket;
  ((local_58._M_head_impl)->options)._M_h._M_bucket_count = 1;
  ((local_58._M_head_impl)->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_58._M_head_impl)->options)._M_h._M_element_count = 0;
  ((local_58._M_head_impl)->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_58._M_head_impl)->options)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_58._M_head_impl)->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (local_58._M_head_impl)->on_conflict = ERROR_ON_CONFLICT;
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pAVar4->name,(string *)&local_50);
    if (local_50 != local_40) goto LAB_01779b36;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pAVar4->name,(string *)&local_50);
    if (local_50 != local_40) {
LAB_01779b36:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"path");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pAVar4->path,(string *)&local_50);
    if (local_50 == local_40) goto LAB_01779bd7;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pAVar4->path,(string *)&local_50);
    if (local_50 == local_40) goto LAB_01779bd7;
  }
  operator_delete(local_50);
LAB_01779bd7:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (deserializer,0xca,"options",&pAVar4->options);
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"on_conflict");
  if ((char)uVar2 == '\0') {
    OVar1 = ERROR_ON_CONFLICT;
  }
  else if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    OVar1 = EnumUtil::FromString<duckdb::OnCreateConflict>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar1 = (OnCreateConflict)iVar3;
  }
  pAVar4->on_conflict = OVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> AttachInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AttachInfo>(new AttachInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<string>(201, "path", result->path);
	deserializer.ReadPropertyWithDefault<unordered_map<string, Value>>(202, "options", result->options);
	deserializer.ReadPropertyWithExplicitDefault<OnCreateConflict>(203, "on_conflict", result->on_conflict, OnCreateConflict::ERROR_ON_CONFLICT);
	return std::move(result);
}